

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_lsrkstep_io.c
# Opt level: O0

int LSRKStepSetSSPMethod(void *arkode_mem,ARKODE_LSRKMethodType method)

{
  undefined4 in_ESI;
  int retval;
  ARKodeLSRKStepMem step_mem;
  ARKodeMem ark_mem;
  ARKodeMem *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  void *in_stack_ffffffffffffffd8;
  ARKodeMem local_20;
  int local_4;
  
  local_4 = lsrkStep_AccessARKODEStepMem
                      (in_stack_ffffffffffffffd8,
                       (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffc8,(ARKodeLSRKStepMem *)0x168a58);
  if (local_4 == 0) {
    switch(in_ESI) {
    case 0:
    case 1:
      arkProcessError(local_20,-0x16,0x68,"LSRKStepSetSSPMethod",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_lsrkstep_io.c"
                      ,
                      "Invalid method option: Call LSRKStepCreateSTS to create an STS method first."
                     );
      break;
    case 2:
      local_20->step = lsrkStep_TakeStepSSPs2;
      *(undefined4 *)((long)in_stack_ffffffffffffffd8 + 0x8c) = 1;
      *(undefined4 *)((long)in_stack_ffffffffffffffd8 + 0x18) = 10;
      *(undefined4 *)((long)in_stack_ffffffffffffffd8 + 0xa0) = 3;
      local_20->hadapt_mem->q = 2;
      *(undefined4 *)((long)in_stack_ffffffffffffffd8 + 0x10) = 2;
      local_20->hadapt_mem->p = 1;
      *(undefined4 *)((long)in_stack_ffffffffffffffd8 + 0x14) = 1;
      break;
    case 3:
      local_20->step = lsrkStep_TakeStepSSPs3;
      *(undefined4 *)((long)in_stack_ffffffffffffffd8 + 0x8c) = 1;
      *(undefined4 *)((long)in_stack_ffffffffffffffd8 + 0x18) = 9;
      *(undefined4 *)((long)in_stack_ffffffffffffffd8 + 0xa0) = 3;
      local_20->hadapt_mem->q = 3;
      *(undefined4 *)((long)in_stack_ffffffffffffffd8 + 0x10) = 3;
      local_20->hadapt_mem->p = 2;
      *(undefined4 *)((long)in_stack_ffffffffffffffd8 + 0x14) = 2;
      break;
    case 4:
      local_20->step = lsrkStep_TakeStepSSP104;
      *(undefined4 *)((long)in_stack_ffffffffffffffd8 + 0x8c) = 1;
      *(undefined4 *)((long)in_stack_ffffffffffffffd8 + 0x18) = 10;
      *(undefined4 *)((long)in_stack_ffffffffffffffd8 + 0xa0) = 3;
      local_20->hadapt_mem->q = 4;
      *(undefined4 *)((long)in_stack_ffffffffffffffd8 + 0x10) = 4;
      local_20->hadapt_mem->p = 3;
      *(undefined4 *)((long)in_stack_ffffffffffffffd8 + 0x14) = 3;
      break;
    default:
      arkProcessError(local_20,-0x16,0x85,"LSRKStepSetSSPMethod",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_lsrkstep_io.c"
                      ,"Invalid method option.");
      return -0x16;
    }
    *(undefined4 *)((long)in_stack_ffffffffffffffd8 + 0x1c) = in_ESI;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int LSRKStepSetSSPMethod(void* arkode_mem, ARKODE_LSRKMethodType method)
{
  ARKodeMem ark_mem;
  ARKodeLSRKStepMem step_mem;
  int retval;

  /* access ARKodeMem and ARKodeLSRKStepMem structures */
  retval = lsrkStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem,
                                        &step_mem);
  if (retval != ARK_SUCCESS) { return retval; }

  switch (method)
  {
  case ARKODE_LSRK_RKC_2:
  case ARKODE_LSRK_RKL_2:
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__,
                    __FILE__, "Invalid method option: Call LSRKStepCreateSTS to create an STS method first.");
    break;
  case ARKODE_LSRK_SSP_S_2:
    ark_mem->step          = lsrkStep_TakeStepSSPs2;
    step_mem->is_SSP       = SUNTRUE;
    step_mem->req_stages   = 10;
    step_mem->nfusedopvecs = 3;
    step_mem->q = ark_mem->hadapt_mem->q = 2;
    step_mem->p = ark_mem->hadapt_mem->p = 1;
    break;
  case ARKODE_LSRK_SSP_S_3:
    ark_mem->step          = lsrkStep_TakeStepSSPs3;
    step_mem->is_SSP       = SUNTRUE;
    step_mem->req_stages   = 9;
    step_mem->nfusedopvecs = 3;
    step_mem->q = ark_mem->hadapt_mem->q = 3;
    step_mem->p = ark_mem->hadapt_mem->p = 2;
    break;
  case ARKODE_LSRK_SSP_10_4:
    ark_mem->step          = lsrkStep_TakeStepSSP104;
    step_mem->is_SSP       = SUNTRUE;
    step_mem->req_stages   = 10;
    step_mem->nfusedopvecs = 3;
    step_mem->q = ark_mem->hadapt_mem->q = 4;
    step_mem->p = ark_mem->hadapt_mem->p = 3;
    break;

  default:
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Invalid method option.");
    return ARK_ILL_INPUT;
  }

  step_mem->LSRKmethod = method;

  return ARK_SUCCESS;
}